

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNInh::gen_code_member
          (CTPNInh *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  short sVar1;
  int iVar2;
  CTcSymFunc *this_00;
  undefined4 uVar3;
  size_t in_RCX;
  long *in_RDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  CTcSymFunc *f;
  CTPNCodeBody *cb;
  vm_prop_id_t prop;
  undefined4 in_stack_00000048;
  CTcSymFunc *in_stack_00000058;
  int in_stack_00000070;
  CTcNamedArgs *in_stack_00000078;
  uchar in_stack_0000009f;
  CTcGenTarg *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  CTcGenTarg *in_stack_ffffffffffffffb0;
  CTPNCodeBody *local_30;
  
  uVar3 = (undefined4)in_RCX;
  iVar2 = CTcGenTarg::is_speculative(G_cg);
  if (iVar2 != 0) {
    err_throw(0);
  }
  local_30 = CTcCodeStream::get_code_body(G_cs);
  while( true ) {
    if (local_30 == (CTPNCodeBody *)0x0) {
      iVar2 = CTcCodeStream::is_self_available(G_cs);
      if (iVar2 == 0) {
        CTcTokenizer::log_error(0x2cef);
      }
      if (*(long *)(in_RDI + 8) != 0) {
        CTcTokenizer::log_error(0x2d26);
      }
      sVar1 = (**(code **)(*in_RDX + 200))(in_RDX,0,uVar3);
      if (sVar1 == 0) {
        if (in_R9D != 0) {
          CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
          CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
        }
        CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf_00,in_RCX);
        CTcGenTarg::note_pop(G_cg,in_R8D + 1);
      }
      else {
        if (in_R9D != 0) {
          CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
        }
        CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf,in_RCX);
        CTcDataStream::write_prop_id
                  ((CTcDataStream *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        CTcGenTarg::note_pop(G_cg,in_R8D);
      }
      CTcGenTarg::post_call_cleanup
                (in_stack_ffffffffffffffb0,
                 (CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (in_ESI == 0) {
        CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
        CTcGenTarg::note_push((CTcGenTarg *)0x2d02d2);
      }
      return;
    }
    this_00 = CTPNCodeBodyBase::get_func_sym(&local_30->super_CTPNCodeBodyBase);
    if ((this_00 != (CTcSymFunc *)0x0) &&
       (iVar2 = CTcSymFuncBase::is_multimethod(&this_00->super_CTcSymFuncBase), iVar2 != 0)) break;
    local_30 = CTPNCodeBodyBase::get_enclosing(&local_30->super_CTPNCodeBodyBase);
  }
  gen_code_mminh((CTPNInh *)named_args,in_stack_00000058,this._4_4_,
                 (CTcPrsNode *)CONCAT44(discard,in_stack_00000048),prop_expr._4_4_,(int)prop_expr,
                 in_stack_00000070,in_stack_00000078);
  return;
}

Assistant:

void CTPNInh::gen_code_member(int discard,
                              CTcPrsNode *prop_expr, int prop_is_expr,
                              int argc, int varargs, CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* don't allow 'inherited' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /*
     *   If we're in a multi-method context, inherited() has a different
     *   meaning from the ordinary method context meaning.
     */
    for (CTPNCodeBody *cb = G_cs->get_code_body() ; cb != 0 ;
         cb = cb->get_enclosing())
    {
        /* check for a multi-method context */
        CTcSymFunc *f = cb->get_func_sym();
        if (f != 0 && f->is_multimethod())
        {
            /* generate the multi-method inherited() code */
            gen_code_mminh(f, discard, prop_expr, prop_is_expr,
                           argc, varargs, named_args);

            /* we're done */
            return;
        }
    }

    /* 
     *   make sure "self" is available - we obviously can't inherit
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* a type list ('inherited<>') is invalid for regular method inheritance */
    if (typelist_ != 0)
        G_tok->log_error(TCERR_MMINH_BAD_CONTEXT);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple INHERIT;
     *   otherwise, generate a PTRINHERIT 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* generate a varargs modifier if necessary */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* we have a constant property ID - generate a regular INHERIT */
        G_cg->write_op(OPC_INHERIT);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);

        /* this removes arguments */
        G_cg->note_pop(argc);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);
            
            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }

        /* a property pointer is on the stack - write a PTRINHERIT */
        G_cg->write_op(OPC_PTRINHERIT);
        G_cs->write((int)argc);

        /* this removes arguments and the property pointer */
        G_cg->note_pop(argc + 1);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}